

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QString * findInPath(QString *__return_storage_ptr__,QString *fileName)

{
  int *piVar1;
  char cVar2;
  QArrayData *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QFileInfo fileInfo;
  undefined1 *local_b0;
  QArrayDataPointer<QString> local_a8;
  QArrayData *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_68;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_a8);
  QVar5.m_data = (storage_type_conflict *)local_a8.size;
  QVar5.m_size = (qsizetype)&local_88;
  QString::fromLocal8Bit(QVar5);
  piVar1 = (int *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_),1,0x10);
    }
  }
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d._0_4_ = 0xaaaaaaaa;
  local_a8.d._4_4_ = 0xaaaaaaaa;
  local_a8.ptr._0_4_ = 0xaaaaaaaa;
  local_a8.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_a8,&local_88,0x3a,0,1);
  if ((undefined1 *)local_a8.size != (undefined1 *)0x0) {
    pQVar3 = (QArrayData *)CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
    lVar4 = local_a8.size * 0x18;
    do {
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_68.a.b = L'/';
      local_68.a.a = (QString *)pQVar3;
      local_68.b = fileName;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                ((QString *)&local_50,&local_68);
      QFileInfo::QFileInfo((QFileInfo *)&local_b0,(QString *)&local_50);
      if ((QArrayData *)local_50.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_50.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_50.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_50.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_50.a.a,2,0x10);
        }
      }
      cVar2 = QFileInfo::exists();
      if (cVar2 != '\0') {
        cVar2 = QFileInfo::isFile();
        if (cVar2 != '\0') {
          cVar2 = QFileInfo::isExecutable();
          if (cVar2 != '\0') {
            local_50.a.b = L'/';
            local_50.a.a = (QString *)pQVar3;
            local_50.b = fileName;
            QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::
            convertTo<QString>(__return_storage_ptr__,&local_50);
            QFileInfo::~QFileInfo((QFileInfo *)&local_b0);
            goto LAB_00122aec;
          }
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_b0);
      pQVar3 = (QArrayData *)&pQVar3[1].alloc;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_00122aec:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString findInPath(const QString &fileName)
{
    const QString path = QString::fromLocal8Bit(qgetenv("PATH"));
#if defined(Q_OS_WIN32)
    QLatin1Char separator(';');
#else
    QLatin1Char separator(':');
#endif

    const QStringList paths = path.split(separator);
    for (const QString &path : paths) {
        QFileInfo fileInfo(path + u'/' + fileName);
        if (fileInfo.exists() && fileInfo.isFile() && fileInfo.isExecutable())
            return path + u'/' + fileName;
    }

    return QString();
}